

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowEntry(Scanner *this)

{
  StringRef local_58;
  undefined1 local_48 [8];
  Token T;
  Scanner *this_local;
  
  T.Value.field_2._8_8_ = this;
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  Token::Token((Token *)local_48);
  local_48._0_4_ = TK_FlowEntry;
  StringRef::StringRef(&local_58,this->Current,1);
  T._0_8_ = local_58.Data;
  T.Range.Data = (char *)local_58.Length;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_48);
  Token::~Token((Token *)local_48);
  return true;
}

Assistant:

bool Scanner::scanFlowEntry() {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_FlowEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}